

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xorfilter.h
# Opt level: O2

_Bool xor8_populate(uint64_t *keys,uint32_t size,xor8_t *filter)

{
  ulong *puVar1;
  ulong uVar2;
  undefined4 uVar3;
  ulong uVar4;
  uint8_t *puVar5;
  uint64_t uVar6;
  void *__s;
  void *__ptr;
  void *__ptr_00;
  long lVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong *puVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  size_t i;
  ulong uVar18;
  _Bool _Var19;
  uint uVar20;
  byte bVar21;
  size_t i_3;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  size_t __size;
  uint64_t rng_counter;
  xor_hashes_t hs;
  ulong local_98;
  uint64_t local_50;
  xor_hashes_t local_48;
  
  if (size == 0) {
    _Var19 = false;
  }
  else {
    local_98 = (ulong)size;
    local_50 = 1;
    uVar6 = xor_rng_splitmix64(&local_50);
    filter->seed = uVar6;
    uVar4 = filter->blockLength;
    __size = uVar4 * 0x30;
    __s = malloc(__size);
    __ptr = malloc(__size);
    __ptr_00 = malloc(local_98 << 4);
    uVar20 = 0;
    if (__ptr_00 != (void *)0x0 && (__ptr != (void *)0x0 && __s != (void *)0x0)) {
      lVar7 = uVar4 * 0x10;
      uVar2 = uVar4 * 2;
      lVar11 = uVar4 * 0x20;
      do {
        if (uVar20 + 1 == 10) {
          local_98 = xor_sort_and_remove_dup(keys,local_98 & 0xffffffff);
        }
        else if (99 < uVar20) {
          uVar20 = 0;
          break;
        }
        memset(__s,0,__size);
        uVar8 = local_98 & 0xffffffff;
        for (uVar18 = 0; uVar8 != uVar18; uVar18 = uVar18 + 1) {
          xor8_get_h0_h1_h2(&local_48,keys[uVar18],filter);
          puVar1 = (ulong *)((long)__s + (ulong)local_48.h0 * 0x10);
          *puVar1 = *puVar1 ^ local_48.h;
          piVar9 = (int *)((long)__s + (ulong)local_48.h0 * 0x10 + 8);
          *piVar9 = *piVar9 + 1;
          puVar1 = (ulong *)((long)__s + (ulong)local_48.h1 * 0x10 + lVar7);
          *puVar1 = *puVar1 ^ local_48.h;
          piVar9 = (int *)((long)__s + (ulong)local_48.h1 * 0x10 + lVar7 + 8);
          *piVar9 = *piVar9 + 1;
          puVar1 = (ulong *)((long)__s + (ulong)local_48.h2 * 0x10 + lVar11);
          *puVar1 = *puVar1 ^ local_48.h;
          piVar9 = (int *)((long)__s + (ulong)local_48.h2 * 0x10 + lVar11 + 8);
          *piVar9 = *piVar9 + 1;
        }
        uVar18 = filter->blockLength;
        lVar12 = 0;
        piVar9 = (int *)((long)__s + 8);
        for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
          if (*piVar9 == 1) {
            *(int *)((long)__ptr + lVar12 * 0x10 + 8) = (int)uVar15;
            *(undefined8 *)((long)__ptr + lVar12 * 0x10) = *(undefined8 *)(piVar9 + -2);
            lVar12 = lVar12 + 1;
          }
          piVar9 = piVar9 + 4;
        }
        lVar10 = 0;
        piVar9 = (int *)((long)__s + lVar7 + 8);
        for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
          if (*piVar9 == 1) {
            *(int *)((long)__ptr + lVar10 * 0x10 + lVar7 + 8) = (int)uVar15;
            *(undefined8 *)((long)__ptr + lVar10 * 0x10 + lVar7) = *(undefined8 *)(piVar9 + -2);
            lVar10 = lVar10 + 1;
          }
          piVar9 = piVar9 + 4;
        }
        lVar16 = 0;
        piVar9 = (int *)((long)__s + lVar11 + 8);
        for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
          if (*piVar9 == 1) {
            *(int *)((long)__ptr + lVar16 * 0x10 + lVar11 + 8) = (int)uVar15;
            *(undefined8 *)((long)__ptr + lVar16 * 0x10 + lVar11) = *(undefined8 *)(piVar9 + -2);
            lVar16 = lVar16 + 1;
          }
          piVar9 = piVar9 + 4;
        }
        uVar18 = uVar18 & 0xffffffff;
        uVar15 = 0;
LAB_00101593:
        if (lVar12 + lVar10 + lVar16 != 0) {
          do {
            lVar22 = -lVar12;
            puVar1 = (ulong *)(lVar12 * 0x10 + (long)__ptr);
            do {
              puVar13 = puVar1;
              lVar22 = lVar22 + 1;
              if (lVar22 == 1) {
                lVar12 = 0;
                goto LAB_001016a4;
              }
              uVar24 = puVar13[-1];
              puVar1 = puVar13 + -2;
            } while (*(int *)((long)__s + (ulong)(uint)uVar24 * 0x10 + 8) == 0);
            uVar23 = puVar13[-2];
            uVar3 = *(undefined4 *)((long)puVar13 + -4);
            uVar14 = ((uint)(uVar23 << 0x15) | (uint)(uVar23 >> 0x2b)) * uVar18;
            lVar12 = uVar15 * 0x10;
            *(ulong *)((long)__ptr_00 + lVar12) = uVar23;
            *(uint *)((long)__ptr_00 + lVar12 + 8) = (uint)uVar24;
            *(undefined4 *)((long)__ptr_00 + lVar12 + 0xc) = uVar3;
            lVar12 = (uVar14 >> 0x20) * 0x10;
            uVar24 = *(ulong *)((long)__s + lVar12 + lVar7) ^ uVar23;
            *(ulong *)((long)__s + lVar12 + lVar7) = uVar24;
            iVar17 = *(int *)((long)__s + lVar12 + lVar7 + 8) + -1;
            *(int *)((long)__s + lVar12 + lVar7 + 8) = iVar17;
            if (iVar17 == 1) {
              *(int *)((long)__ptr + lVar10 * 0x10 + lVar7 + 8) = (int)(uVar14 >> 0x20);
              *(ulong *)((long)__ptr + lVar10 * 0x10 + lVar7) = uVar24;
              lVar10 = lVar10 + 1;
            }
            uVar24 = (uVar23 >> 0x16 & 0xffffffff) * uVar18;
            uVar15 = uVar15 + 1;
            lVar12 = -lVar22;
            lVar25 = (uVar24 >> 0x20) * 0x10;
            uVar23 = uVar23 ^ *(ulong *)((long)__s + lVar25 + lVar11);
            *(ulong *)((long)__s + lVar25 + lVar11) = uVar23;
            iVar17 = *(int *)((long)__s + lVar25 + lVar11 + 8) + -1;
            *(int *)((long)__s + lVar25 + lVar11 + 8) = iVar17;
            if (iVar17 == 1) {
              *(int *)((long)__ptr + lVar16 * 0x10 + lVar11 + 8) = (int)(uVar24 >> 0x20);
              *(ulong *)((long)__ptr + lVar16 * 0x10 + lVar11) = uVar23;
              lVar16 = lVar16 + 1;
              lVar12 = -lVar22;
            }
          } while( true );
        }
        if (uVar15 == uVar8) {
          puVar5 = filter->fingerprints;
          for (lVar7 = uVar8 << 4; lVar7 != 0; lVar7 = lVar7 + -0x10) {
            uVar8 = *(ulong *)((long)__ptr_00 + lVar7 + -0x10);
            uVar15 = (ulong)*(uint *)((long)__ptr_00 + lVar7 + -8);
            uVar24 = (ulong)(uint)filter->blockLength;
            uVar18 = uVar2;
            if (uVar15 < uVar4) {
              bVar21 = puVar5[(((uint)(uVar8 << 0x15) | (uint)(uVar8 >> 0x2b)) * uVar24 >> 0x20) +
                              uVar4];
              uVar23 = uVar8 >> 0x16;
            }
            else {
              bVar21 = puVar5[(uVar8 & 0xffffffff) * uVar24 >> 0x20];
              if (uVar15 < uVar2) {
                uVar23 = uVar8 >> 0x16;
              }
              else {
                uVar23 = uVar8 << 0x15 | uVar8 >> 0x2b;
                uVar18 = uVar4;
              }
            }
            filter->fingerprints[uVar15] =
                 (byte)(uVar8 >> 0x20) ^ (byte)uVar8 ^
                 bVar21 ^ puVar5[(uVar24 * (uVar23 & 0xffffffff) >> 0x20) + uVar18];
          }
          uVar20 = 1;
          break;
        }
        uVar6 = xor_rng_splitmix64(&local_50);
        filter->seed = uVar6;
        uVar20 = uVar20 + 1;
      } while( true );
    }
    _Var19 = SUB41(uVar20,0);
    free(__s);
    free(__ptr);
    free(__ptr_00);
  }
  return _Var19;
LAB_001016a4:
  lVar22 = -lVar10;
  puVar1 = (ulong *)((long)__ptr + lVar10 * 0x10 + lVar7);
  do {
    puVar13 = puVar1;
    lVar22 = lVar22 + 1;
    if (lVar22 == 1) {
      lVar10 = 0;
      goto LAB_001017a9;
    }
    uVar24 = puVar13[-1];
    puVar1 = puVar13 + -2;
  } while (*(int *)((long)__s + (ulong)(uint)uVar24 * 0x10 + lVar7 + 8) == 0);
  uVar23 = puVar13[-2];
  uVar3 = *(undefined4 *)((long)puVar13 + -4);
  uVar14 = (uVar23 & 0xffffffff) * uVar18;
  lVar10 = uVar15 * 0x10;
  *(ulong *)((long)__ptr_00 + lVar10) = uVar23;
  *(uint *)((long)__ptr_00 + lVar10 + 8) = (uint)uVar24 + (int)uVar4;
  *(undefined4 *)((long)__ptr_00 + lVar10 + 0xc) = uVar3;
  lVar10 = (uVar14 >> 0x20) * 0x10;
  uVar24 = *(ulong *)((long)__s + lVar10) ^ uVar23;
  *(ulong *)((long)__s + lVar10) = uVar24;
  iVar17 = *(int *)((long)__s + lVar10 + 8) + -1;
  *(int *)((long)__s + lVar10 + 8) = iVar17;
  if (iVar17 == 1) {
    *(int *)((long)__ptr + lVar12 * 0x10 + 8) = (int)(uVar14 >> 0x20);
    *(ulong *)((long)__ptr + lVar12 * 0x10) = uVar24;
    lVar12 = lVar12 + 1;
  }
  uVar24 = (uVar23 >> 0x16 & 0xffffffff) * uVar18;
  uVar15 = uVar15 + 1;
  lVar10 = -lVar22;
  lVar22 = (uVar24 >> 0x20) * 0x10;
  uVar23 = uVar23 ^ *(ulong *)((long)__s + lVar22 + lVar11);
  *(ulong *)((long)__s + lVar22 + lVar11) = uVar23;
  iVar17 = *(int *)((long)__s + lVar22 + lVar11 + 8) + -1;
  *(int *)((long)__s + lVar22 + lVar11 + 8) = iVar17;
  if (iVar17 == 1) {
    *(int *)((long)__ptr + lVar16 * 0x10 + lVar11 + 8) = (int)(uVar24 >> 0x20);
    *(ulong *)((long)__ptr + lVar16 * 0x10 + lVar11) = uVar23;
    lVar16 = lVar16 + 1;
  }
  goto LAB_001016a4;
LAB_001017a9:
  lVar22 = -lVar16;
  puVar1 = (ulong *)((long)__ptr + lVar16 * 0x10 + lVar11);
  do {
    puVar13 = puVar1;
    lVar22 = lVar22 + 1;
    if (lVar22 == 1) {
      lVar16 = 0;
      goto LAB_00101593;
    }
    uVar24 = puVar13[-1];
    puVar1 = puVar13 + -2;
  } while (*(int *)((long)__s + (ulong)(uint)uVar24 * 0x10 + lVar11 + 8) == 0);
  uVar23 = puVar13[-2];
  uVar3 = *(undefined4 *)((long)puVar13 + -4);
  uVar14 = (uVar23 & 0xffffffff) * uVar18;
  lVar16 = uVar15 * 0x10;
  *(ulong *)((long)__ptr_00 + lVar16) = uVar23;
  *(uint *)((long)__ptr_00 + lVar16 + 8) = (uint)uVar24 + (int)uVar4 * 2;
  *(undefined4 *)((long)__ptr_00 + lVar16 + 0xc) = uVar3;
  lVar16 = (uVar14 >> 0x20) * 0x10;
  uVar24 = *(ulong *)((long)__s + lVar16) ^ uVar23;
  *(ulong *)((long)__s + lVar16) = uVar24;
  iVar17 = *(int *)((long)__s + lVar16 + 8) + -1;
  *(int *)((long)__s + lVar16 + 8) = iVar17;
  if (iVar17 == 1) {
    *(int *)((long)__ptr + lVar12 * 0x10 + 8) = (int)(uVar14 >> 0x20);
    *(ulong *)((long)__ptr + lVar12 * 0x10) = uVar24;
    lVar12 = lVar12 + 1;
  }
  uVar24 = ((uint)(uVar23 << 0x15) | (uint)(uVar23 >> 0x2b)) * uVar18;
  uVar15 = uVar15 + 1;
  lVar16 = -lVar22;
  lVar22 = (uVar24 >> 0x20) * 0x10;
  uVar23 = uVar23 ^ *(ulong *)((long)__s + lVar22 + lVar7);
  *(ulong *)((long)__s + lVar22 + lVar7) = uVar23;
  iVar17 = *(int *)((long)__s + lVar22 + lVar7 + 8) + -1;
  *(int *)((long)__s + lVar22 + lVar7 + 8) = iVar17;
  if (iVar17 == 1) {
    *(int *)((long)__ptr + lVar10 * 0x10 + lVar7 + 8) = (int)(uVar24 >> 0x20);
    *(ulong *)((long)__ptr + lVar10 * 0x10 + lVar7) = uVar23;
    lVar10 = lVar10 + 1;
  }
  goto LAB_001017a9;
}

Assistant:

static inline bool xor8_populate(uint64_t *keys, uint32_t size, xor8_t *filter) {
  if(size == 0) { return false; }
  uint64_t rng_counter = 1;
  filter->seed = xor_rng_splitmix64(&rng_counter);
  size_t arrayLength = (size_t)(filter->blockLength) * 3; // size of the backing array
  size_t blockLength = (size_t)(filter->blockLength);

  xor_xorset_t *sets =
      (xor_xorset_t *)malloc(arrayLength * sizeof(xor_xorset_t));

  xor_keyindex_t *Q =
      (xor_keyindex_t *)malloc(arrayLength * sizeof(xor_keyindex_t));

  xor_keyindex_t *stack =
      (xor_keyindex_t *)malloc(size * sizeof(xor_keyindex_t));

  if ((sets == NULL) || (Q == NULL) || (stack == NULL)) {
    free(sets);
    free(Q);
    free(stack);
    return false;
  }
  xor_xorset_t *sets0 = sets;
  xor_xorset_t *sets1 = sets + blockLength;
  xor_xorset_t *sets2 = sets + 2 * blockLength;
  xor_keyindex_t *Q0 = Q;
  xor_keyindex_t *Q1 = Q + blockLength;
  xor_keyindex_t *Q2 = Q + 2 * blockLength;

  int iterations = 0;

  while (true) {
    iterations ++;
    if(iterations == XOR_SORT_ITERATIONS) {
      size = (uint32_t)xor_sort_and_remove_dup(keys, size);
    }
    if(iterations > XOR_MAX_ITERATIONS) {
      // The probability of this happening is lower than the
      // the cosmic-ray probability (i.e., a cosmic ray corrupts your system).
      free(sets);
      free(Q);
      free(stack);
      return false;
    }

    memset(sets, 0, sizeof(xor_xorset_t) * arrayLength);
    for (size_t i = 0; i < size; i++) {
      uint64_t key = keys[i];
      xor_hashes_t hs = xor8_get_h0_h1_h2(key, filter);
      sets0[hs.h0].xormask ^= hs.h;
      sets0[hs.h0].count++;
      sets1[hs.h1].xormask ^= hs.h;
      sets1[hs.h1].count++;
      sets2[hs.h2].xormask ^= hs.h;
      sets2[hs.h2].count++;
    }
    // todo: the flush should be sync with the detection that follows
    // scan for values with a count of one
    size_t Q0size = 0, Q1size = 0, Q2size = 0;
    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets0[i].count == 1) {
        Q0[Q0size].index = (uint32_t)i;
        Q0[Q0size].hash = sets0[i].xormask;
        Q0size++;
      }
    }

    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets1[i].count == 1) {
        Q1[Q1size].index = (uint32_t)i;
        Q1[Q1size].hash = sets1[i].xormask;
        Q1size++;
      }
    }
    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets2[i].count == 1) {
        Q2[Q2size].index = (uint32_t)i;
        Q2[Q2size].hash = sets2[i].xormask;
        Q2size++;
      }
    }

    size_t stack_size = 0;
    while (Q0size + Q1size + Q2size > 0) {
      while (Q0size > 0) {
        xor_keyindex_t keyindex = Q0[--Q0size];
        size_t index = keyindex.index;
        if (sets0[index].count == 0)
          continue; // not actually possible after the initial scan.
        //sets0[index].count = 0;
        uint64_t hash = keyindex.hash;
        uint32_t h1 = xor8_get_h1(hash, filter);
        uint32_t h2 = xor8_get_h2(hash, filter);

        stack[stack_size] = keyindex;
        stack_size++;
        sets1[h1].xormask ^= hash;
        sets1[h1].count--;
        if (sets1[h1].count == 1) {
          Q1[Q1size].index = h1;
          Q1[Q1size].hash = sets1[h1].xormask;
          Q1size++;
        }
        sets2[h2].xormask ^= hash;
        sets2[h2].count--;
        if (sets2[h2].count == 1) {
          Q2[Q2size].index = h2;
          Q2[Q2size].hash = sets2[h2].xormask;
          Q2size++;
        }
      }
      while (Q1size > 0) {
        xor_keyindex_t keyindex = Q1[--Q1size];
        size_t index = keyindex.index;
        if (sets1[index].count == 0)
          continue;
        //sets1[index].count = 0;
        uint64_t hash = keyindex.hash;
        uint32_t h0 = xor8_get_h0(hash, filter);
        uint32_t h2 = xor8_get_h2(hash, filter);
        keyindex.index += (uint32_t)blockLength;
        stack[stack_size] = keyindex;
        stack_size++;
        sets0[h0].xormask ^= hash;
        sets0[h0].count--;
        if (sets0[h0].count == 1) {
          Q0[Q0size].index = h0;
          Q0[Q0size].hash = sets0[h0].xormask;
          Q0size++;
        }
        sets2[h2].xormask ^= hash;
        sets2[h2].count--;
        if (sets2[h2].count == 1) {
          Q2[Q2size].index = h2;
          Q2[Q2size].hash = sets2[h2].xormask;
          Q2size++;
        }
      }
      while (Q2size > 0) {
        xor_keyindex_t keyindex = Q2[--Q2size];
        size_t index = keyindex.index;
        if (sets2[index].count == 0)
          continue;

        //sets2[index].count = 0;
        uint64_t hash = keyindex.hash;

        uint32_t h0 = xor8_get_h0(hash, filter);
        uint32_t h1 = xor8_get_h1(hash, filter);
        keyindex.index += 2 * (uint32_t)blockLength;

        stack[stack_size] = keyindex;
        stack_size++;
        sets0[h0].xormask ^= hash;
        sets0[h0].count--;
        if (sets0[h0].count == 1) {
          Q0[Q0size].index = h0;
          Q0[Q0size].hash = sets0[h0].xormask;
          Q0size++;
        }
        sets1[h1].xormask ^= hash;
        sets1[h1].count--;
        if (sets1[h1].count == 1) {
          Q1[Q1size].index = h1;
          Q1[Q1size].hash = sets1[h1].xormask;
          Q1size++;
        }

      }
    }
    if (stack_size == size) {
      // success
      break;
    }

    filter->seed = xor_rng_splitmix64(&rng_counter);
  }
  uint8_t * fingerprints0 = filter->fingerprints;
  uint8_t * fingerprints1 = filter->fingerprints + blockLength;
  uint8_t * fingerprints2 = filter->fingerprints + 2 * blockLength;

  size_t stack_size = size;
  while (stack_size > 0) {
    xor_keyindex_t ki = stack[--stack_size];
    uint64_t val = xor_fingerprint(ki.hash);
    if(ki.index < blockLength) {
      val ^= (uint32_t)fingerprints1[xor8_get_h1(ki.hash,filter)] ^ fingerprints2[xor8_get_h2(ki.hash,filter)];
    } else if(ki.index < 2 * blockLength) {
      val ^= (uint32_t)fingerprints0[xor8_get_h0(ki.hash,filter)] ^ fingerprints2[xor8_get_h2(ki.hash,filter)];
    } else {
      val ^= (uint32_t)fingerprints0[xor8_get_h0(ki.hash,filter)] ^ fingerprints1[xor8_get_h1(ki.hash,filter)];
    }
    filter->fingerprints[ki.index] = (uint8_t)val;
  }

  free(sets);
  free(Q);
  free(stack);
  return true;
}